

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O0

void __thiscall
NativeCodeGenerator::AllocateBackgroundCodeGenProfiler
          (NativeCodeGenerator *this,PageAllocator *pageAllocator)

{
  bool bVar1;
  NoCheckHeapAllocator *alloc;
  ScriptContextProfiler *this_00;
  TrackAllocData local_48;
  ScriptContextProfiler *codegenProfiler;
  PageAllocator *pageAllocator_local;
  NativeCodeGenerator *this_local;
  
  codegenProfiler = (ScriptContextProfiler *)pageAllocator;
  pageAllocator_local = (PageAllocator *)this;
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,ProfileFlag);
  if (bVar1) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&Js::ScriptContextProfiler::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
               ,0xdfc);
    alloc = Memory::NoCheckHeapAllocator::TrackAllocInfo
                      ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,&local_48);
    this_00 = (ScriptContextProfiler *)new<Memory::NoCheckHeapAllocator>(0x40,alloc,0x3d5f00);
    Js::ScriptContextProfiler::ScriptContextProfiler(this_00);
    this_00->pageAllocator = (PageAllocator *)codegenProfiler;
    this_00->next = this->backgroundCodeGenProfiler;
    this->backgroundCodeGenProfiler = this_00;
  }
  return;
}

Assistant:

void NativeCodeGenerator::AllocateBackgroundCodeGenProfiler(PageAllocator *pageAllocator)
{
#ifdef PROFILE_EXEC
if (Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))
{
    Js::ScriptContextProfiler *codegenProfiler = NoCheckHeapNew(Js::ScriptContextProfiler);
    codegenProfiler->pageAllocator = pageAllocator;
    codegenProfiler->next = this->backgroundCodeGenProfiler;
    this->backgroundCodeGenProfiler = codegenProfiler;
}
#endif
}